

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void attachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  Btree *p;
  int iVar1;
  char *pcVar2;
  Schema *pSVar3;
  Pager *pPager_00;
  int iDb;
  Pager *pPager;
  sqlite3_vfs *pVfs;
  char *zErrDyn;
  Db *pNew;
  Db *aNew;
  char *pcStack_50;
  uint flags;
  char *zErr;
  char *zPath;
  char *zFile;
  char *zName;
  sqlite3 *db;
  int rc;
  int i;
  sqlite3_value **argv_local;
  sqlite3_context *psStack_10;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  db._0_4_ = 0;
  _rc = argv;
  argv_local._4_4_ = NotUsed;
  psStack_10 = context;
  zName = (char *)sqlite3_context_db_handle(context);
  zErr = (char *)0x0;
  pcStack_50 = (char *)0x0;
  pVfs = (sqlite3_vfs *)0x0;
  zPath = (char *)sqlite3_value_text(*_rc);
  zFile = (char *)sqlite3_value_text(_rc[1]);
  if (zPath == (char *)0x0) {
    zPath = "";
  }
  if ((uchar *)zFile == (uchar *)0x0) {
    zFile = "";
  }
  if (((byte)zName[0xc6] >> 2 & 1) == 0) {
    if (*(int *)(zName + 0xa4) + 2 <= *(int *)(zName + 0x28)) {
      pVfs = (sqlite3_vfs *)
             sqlite3MPrintf((sqlite3 *)zName,"too many attached databases - max %d",
                            (ulong)*(uint *)(zName + 0xa4));
      goto LAB_001d26d3;
    }
    for (db._4_4_ = 0; db._4_4_ < *(int *)(zName + 0x28); db._4_4_ = db._4_4_ + 1) {
      iVar1 = sqlite3DbIsNamed((sqlite3 *)zName,db._4_4_,zFile);
      if (iVar1 != 0) {
        pVfs = (sqlite3_vfs *)sqlite3MPrintf((sqlite3 *)zName,"database %s is already in use",zFile)
        ;
        goto LAB_001d26d3;
      }
    }
    if (*(char **)(zName + 0x20) == zName + 0x290) {
      pNew = (Db *)sqlite3DbMallocRawNN((sqlite3 *)zName,0x60);
      if (pNew == (Db *)0x0) {
        return;
      }
      memcpy(pNew,*(void **)(zName + 0x20),0x40);
    }
    else {
      pNew = (Db *)sqlite3DbRealloc((sqlite3 *)zName,*(void **)(zName + 0x20),
                                    (long)(*(int *)(zName + 0x28) + 1) << 5);
      if (pNew == (Db *)0x0) {
        return;
      }
    }
    *(Db **)(zName + 0x20) = pNew;
    zErrDyn = (char *)(*(long *)(zName + 0x20) + (long)*(int *)(zName + 0x28) * 0x20);
    memset(zErrDyn,0,0x20);
    aNew._4_4_ = *(uint *)(zName + 0x4c);
    db._0_4_ = sqlite3ParseUri(*(char **)(*(long *)zName + 0x18),zPath,(uint *)((long)&aNew + 4),
                               (sqlite3_vfs **)&pPager,&zErr,&stack0xffffffffffffffb0);
    if ((int)db != 0) {
      if ((int)db == 7) {
        sqlite3OomFault((sqlite3 *)zName);
      }
      sqlite3_result_error(psStack_10,pcStack_50,-1);
      sqlite3_free(pcStack_50);
      return;
    }
    aNew._4_4_ = aNew._4_4_ | 0x100;
    db._0_4_ = sqlite3BtreeOpen((sqlite3_vfs *)pPager,zErr,(sqlite3 *)zName,(Btree **)(zErrDyn + 8),
                                0,aNew._4_4_);
    *(int *)(zName + 0x28) = *(int *)(zName + 0x28) + 1;
    pcVar2 = sqlite3DbStrDup((sqlite3 *)zName,zFile);
    *(char **)zErrDyn = pcVar2;
  }
  else {
    pPager = (Pager *)sqlite3_vfs_find("memdb");
    if (pPager == (Pager *)0x0) {
      return;
    }
    zErrDyn = (char *)(*(long *)(zName + 0x20) + (ulong)(byte)zName[0xc4] * 0x20);
    if (*(long *)(zErrDyn + 8) != 0) {
      sqlite3BtreeClose(*(Btree **)(zErrDyn + 8));
    }
    zErrDyn[8] = '\0';
    zErrDyn[9] = '\0';
    zErrDyn[10] = '\0';
    zErrDyn[0xb] = '\0';
    zErrDyn[0xc] = '\0';
    zErrDyn[0xd] = '\0';
    zErrDyn[0xe] = '\0';
    zErrDyn[0xf] = '\0';
    zErrDyn[0x18] = '\0';
    zErrDyn[0x19] = '\0';
    zErrDyn[0x1a] = '\0';
    zErrDyn[0x1b] = '\0';
    zErrDyn[0x1c] = '\0';
    zErrDyn[0x1d] = '\0';
    zErrDyn[0x1e] = '\0';
    zErrDyn[0x1f] = '\0';
    db._0_4_ = sqlite3BtreeOpen((sqlite3_vfs *)pPager,"x",(sqlite3 *)zName,(Btree **)(zErrDyn + 8),0
                                ,0x100);
  }
  zName[0x6f] = '\0';
  if ((int)db == 0x13) {
    db._0_4_ = 1;
    pVfs = (sqlite3_vfs *)sqlite3MPrintf((sqlite3 *)zName,"database is already attached");
  }
  else if ((int)db == 0) {
    pSVar3 = sqlite3SchemaGet((sqlite3 *)zName,*(Btree **)(zErrDyn + 8));
    *(Schema **)(zErrDyn + 0x18) = pSVar3;
    if (*(long *)(zErrDyn + 0x18) == 0) {
      db._0_4_ = 7;
    }
    else if ((*(char *)(*(long *)(zErrDyn + 0x18) + 0x70) != '\0') &&
            (*(char *)(*(long *)(zErrDyn + 0x18) + 0x71) != zName[100])) {
      pVfs = (sqlite3_vfs *)
             sqlite3MPrintf((sqlite3 *)zName,
                            "attached databases must use the same text encoding as main database");
      db._0_4_ = 1;
    }
    sqlite3BtreeEnter(*(Btree **)(zErrDyn + 8));
    pPager_00 = sqlite3BtreePager(*(Btree **)(zErrDyn + 8));
    sqlite3PagerLockingMode(pPager_00,(uint)(byte)zName[0x69]);
    p = *(Btree **)(zErrDyn + 8);
    iVar1 = sqlite3BtreeSecureDelete(*(Btree **)(*(long *)(zName + 0x20) + 8),-1);
    sqlite3BtreeSecureDelete(p,iVar1);
    sqlite3BtreeSetPagerFlags
              (*(Btree **)(zErrDyn + 8),(uint)*(undefined8 *)(zName + 0x30) & 0x38 | 3);
    sqlite3BtreeLeave(*(Btree **)(zErrDyn + 8));
  }
  zErrDyn[0x10] = '\x03';
  if (((int)db == 0) && (*(long *)zErrDyn == 0)) {
    db._0_4_ = 7;
  }
  sqlite3_free_filename(zErr);
  if ((int)db == 0) {
    sqlite3BtreeEnterAll((sqlite3 *)zName);
    zName[0xc4] = '\0';
    *(uint *)(zName + 0x2c) = *(uint *)(zName + 0x2c) & 0xffffffef;
    if (((byte)zName[0xc6] >> 2 & 1) == 0) {
      db._0_4_ = sqlite3Init((sqlite3 *)zName,(char **)&pVfs);
    }
    sqlite3BtreeLeaveAll((sqlite3 *)zName);
  }
  if ((int)db == 0) {
    return;
  }
  if (((byte)zName[0xc6] >> 2 & 1) == 0) {
    iVar1 = *(int *)(zName + 0x28) + -1;
    if (*(long *)(*(long *)(zName + 0x20) + (long)iVar1 * 0x20 + 8) != 0) {
      sqlite3BtreeClose(*(Btree **)(*(long *)(zName + 0x20) + (long)iVar1 * 0x20 + 8));
      *(undefined8 *)(*(long *)(zName + 0x20) + (long)iVar1 * 0x20 + 8) = 0;
      *(undefined8 *)(*(long *)(zName + 0x20) + (long)iVar1 * 0x20 + 0x18) = 0;
    }
    sqlite3ResetAllSchemasOfConnection((sqlite3 *)zName);
    *(int *)(zName + 0x28) = iVar1;
    if (((int)db == 7) || ((int)db == 0xc0a)) {
      sqlite3OomFault((sqlite3 *)zName);
      sqlite3DbFree((sqlite3 *)zName,pVfs);
      pVfs = (sqlite3_vfs *)sqlite3MPrintf((sqlite3 *)zName,"out of memory");
    }
    else if (pVfs == (sqlite3_vfs *)0x0) {
      pVfs = (sqlite3_vfs *)sqlite3MPrintf((sqlite3 *)zName,"unable to open database: %s",zPath);
    }
  }
LAB_001d26d3:
  if (pVfs != (sqlite3_vfs *)0x0) {
    sqlite3_result_error(psStack_10,(char *)pVfs,-1);
    sqlite3DbFree((sqlite3 *)zName,pVfs);
  }
  if ((int)db != 0) {
    sqlite3_result_error_code(psStack_10,(int)db);
  }
  return;
}

Assistant:

static void attachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  int i;
  int rc = 0;
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zName;
  const char *zFile;
  char *zPath = 0;
  char *zErr = 0;
  unsigned int flags;
  Db *aNew;                 /* New array of Db pointers */
  Db *pNew;                 /* Db object for the newly attached database */
  char *zErrDyn = 0;
  sqlite3_vfs *pVfs;

  UNUSED_PARAMETER(NotUsed);
  zFile = (const char *)sqlite3_value_text(argv[0]);
  zName = (const char *)sqlite3_value_text(argv[1]);
  if( zFile==0 ) zFile = "";
  if( zName==0 ) zName = "";

#ifndef SQLITE_OMIT_DESERIALIZE
# define REOPEN_AS_MEMDB(db)  (db->init.reopenMemdb)
#else
# define REOPEN_AS_MEMDB(db)  (0)
#endif

  if( REOPEN_AS_MEMDB(db) ){
    /* This is not a real ATTACH.  Instead, this routine is being called
    ** from sqlite3_deserialize() to close database db->init.iDb and
    ** reopen it as a MemDB */
    pVfs = sqlite3_vfs_find("memdb");
    if( pVfs==0 ) return;
    pNew = &db->aDb[db->init.iDb];
    if( pNew->pBt ) sqlite3BtreeClose(pNew->pBt);
    pNew->pBt = 0;
    pNew->pSchema = 0;
    rc = sqlite3BtreeOpen(pVfs, "x\0", db, &pNew->pBt, 0, SQLITE_OPEN_MAIN_DB);
  }else{
    /* This is a real ATTACH
    **
    ** Check for the following errors:
    **
    **     * Too many attached databases,
    **     * Transaction currently open
    **     * Specified database name already being used.
    */
    if( db->nDb>=db->aLimit[SQLITE_LIMIT_ATTACHED]+2 ){
      zErrDyn = sqlite3MPrintf(db, "too many attached databases - max %d",
        db->aLimit[SQLITE_LIMIT_ATTACHED]
      );
      goto attach_error;
    }
    for(i=0; i<db->nDb; i++){
      assert( zName );
      if( sqlite3DbIsNamed(db, i, zName) ){
        zErrDyn = sqlite3MPrintf(db, "database %s is already in use", zName);
        goto attach_error;
      }
    }

    /* Allocate the new entry in the db->aDb[] array and initialize the schema
    ** hash tables.
    */
    if( db->aDb==db->aDbStatic ){
      aNew = sqlite3DbMallocRawNN(db, sizeof(db->aDb[0])*3 );
      if( aNew==0 ) return;
      memcpy(aNew, db->aDb, sizeof(db->aDb[0])*2);
    }else{
      aNew = sqlite3DbRealloc(db, db->aDb, sizeof(db->aDb[0])*(db->nDb+1) );
      if( aNew==0 ) return;
    }
    db->aDb = aNew;
    pNew = &db->aDb[db->nDb];
    memset(pNew, 0, sizeof(*pNew));

    /* Open the database file. If the btree is successfully opened, use
    ** it to obtain the database schema. At this point the schema may
    ** or may not be initialized.
    */
    flags = db->openFlags;
    rc = sqlite3ParseUri(db->pVfs->zName, zFile, &flags, &pVfs, &zPath, &zErr);
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
      sqlite3_result_error(context, zErr, -1);
      sqlite3_free(zErr);
      return;
    }
    assert( pVfs );
    flags |= SQLITE_OPEN_MAIN_DB;
    rc = sqlite3BtreeOpen(pVfs, zPath, db, &pNew->pBt, 0, flags);
    db->nDb++;
    pNew->zDbSName = sqlite3DbStrDup(db, zName);
  }
  db->noSharedCache = 0;
  if( rc==SQLITE_CONSTRAINT ){
    rc = SQLITE_ERROR;
    zErrDyn = sqlite3MPrintf(db, "database is already attached");
  }else if( rc==SQLITE_OK ){
    Pager *pPager;
    pNew->pSchema = sqlite3SchemaGet(db, pNew->pBt);
    if( !pNew->pSchema ){
      rc = SQLITE_NOMEM_BKPT;
    }else if( pNew->pSchema->file_format && pNew->pSchema->enc!=ENC(db) ){
      zErrDyn = sqlite3MPrintf(db,
        "attached databases must use the same text encoding as main database");
      rc = SQLITE_ERROR;
    }
    sqlite3BtreeEnter(pNew->pBt);
    pPager = sqlite3BtreePager(pNew->pBt);
    sqlite3PagerLockingMode(pPager, db->dfltLockMode);
    sqlite3BtreeSecureDelete(pNew->pBt,
                             sqlite3BtreeSecureDelete(db->aDb[0].pBt,-1) );
#ifndef SQLITE_OMIT_PAGER_PRAGMAS
    sqlite3BtreeSetPagerFlags(pNew->pBt,
                      PAGER_SYNCHRONOUS_FULL | (db->flags & PAGER_FLAGS_MASK));
#endif
    sqlite3BtreeLeave(pNew->pBt);
  }
  pNew->safety_level = SQLITE_DEFAULT_SYNCHRONOUS+1;
  if( rc==SQLITE_OK && pNew->zDbSName==0 ){
    rc = SQLITE_NOMEM_BKPT;
  }
  sqlite3_free_filename( zPath );

  /* If the file was opened successfully, read the schema for the new database.
  ** If this fails, or if opening the file failed, then close the file and
  ** remove the entry from the db->aDb[] array. i.e. put everything back the
  ** way we found it.
  */
  if( rc==SQLITE_OK ){
    sqlite3BtreeEnterAll(db);
    db->init.iDb = 0;
    db->mDbFlags &= ~(DBFLAG_SchemaKnownOk);
    if( !REOPEN_AS_MEMDB(db) ){
      rc = sqlite3Init(db, &zErrDyn);
    }
    sqlite3BtreeLeaveAll(db);
    assert( zErrDyn==0 || rc!=SQLITE_OK );
  }
#ifdef SQLITE_USER_AUTHENTICATION
  if( rc==SQLITE_OK && !REOPEN_AS_MEMDB(db) ){
    u8 newAuth = 0;
    rc = sqlite3UserAuthCheckLogin(db, zName, &newAuth);
    if( newAuth<db->auth.authLevel ){
      rc = SQLITE_AUTH_USER;
    }
  }
#endif
  if( rc ){
    if( !REOPEN_AS_MEMDB(db) ){
      int iDb = db->nDb - 1;
      assert( iDb>=2 );
      if( db->aDb[iDb].pBt ){
        sqlite3BtreeClose(db->aDb[iDb].pBt);
        db->aDb[iDb].pBt = 0;
        db->aDb[iDb].pSchema = 0;
      }
      sqlite3ResetAllSchemasOfConnection(db);
      db->nDb = iDb;
      if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ){
        sqlite3OomFault(db);
        sqlite3DbFree(db, zErrDyn);
        zErrDyn = sqlite3MPrintf(db, "out of memory");
      }else if( zErrDyn==0 ){
        zErrDyn = sqlite3MPrintf(db, "unable to open database: %s", zFile);
      }
    }
    goto attach_error;
  }

  return;

attach_error:
  /* Return an error if we get here */
  if( zErrDyn ){
    sqlite3_result_error(context, zErrDyn, -1);
    sqlite3DbFree(db, zErrDyn);
  }
  if( rc ) sqlite3_result_error_code(context, rc);
}